

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void sha512_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  SHA512_CTX copy;
  SHA512_CTX SStack_f8;
  
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    memcpy(&SStack_f8,_ctx + 1,0xd8);
    SHA512_Final((uchar *)md,&SStack_f8);
    (*ptls_clear_memory)(&SStack_f8,0xd8);
    return;
  }
  if (md != (void *)0x0) {
    SHA512_Final((uchar *)md,(SHA512_CTX *)(_ctx + 1));
  }
  if (mode != PTLS_HASH_FINAL_MODE_RESET) {
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)(_ctx + 1,0xd8);
      free(_ctx);
      return;
    }
    __assert_fail("!\"FIXME\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                  0x5d1,"void sha512_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
  }
  SHA512_Init((SHA512_CTX *)(_ctx + 1));
  return;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                            ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const ptls_openssl_signature_scheme_t *scheme;

    /* Just resume the asynchronous operation, if one is in flight. */
#if PTLS_OPENSSL_HAVE_ASYNC
    if (async != NULL && *async != NULL) {
        struct async_sign_ctx *sign_ctx = (struct async_sign_ctx *)(*async);
        *selected_algorithm = sign_ctx->scheme->scheme_id;
        return do_sign_async(outbuf, async);
    }
#endif

    /* Select the algorithm or return failure if none found. */
    if ((scheme = ptls_openssl_select_signature_scheme(self->schemes, algorithms, num_algorithms)) == NULL)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    *selected_algorithm = scheme->scheme_id;

#if PTLS_OPENSSL_HAVE_ASYNC
    if (!self->async && async != NULL) {
        /* indicate to `do_sign` that async mode is disabled for this operation */
        assert(*async == NULL);
        async = NULL;
    }
#endif
    return do_sign(self->key, scheme, outbuf, input, async);
}